

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_copy.cpp
# Opt level: O1

BoundStatement * __thiscall
duckdb::Binder::BindCopyFrom
          (BoundStatement *__return_storage_ptr__,Binder *this,CopyStatement *stmt)

{
  ClientContext *pCVar1;
  copy_from_bind_t p_Var2;
  tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> tVar3;
  pointer pcVar4;
  undefined1 this_00 [8];
  undefined8 uVar5;
  pointer pCVar6;
  pointer pLVar7;
  LogicalInsert *pLVar8;
  Catalog *this_01;
  pointer pCVar9;
  pointer pCVar10;
  ColumnList *pCVar11;
  ColumnDefinition *pCVar12;
  PhysicalIndex __n;
  reference pvVar13;
  reference pvVar14;
  string *__x;
  type pCVar15;
  pointer this_02;
  ParserException *this_03;
  NotImplementedException *this_04;
  long lVar16;
  size_type __n_00;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *this_05;
  column_t column_id;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  ColumnListIterator CVar18;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> function_data;
  templated_unique_single_t get;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  expected_names;
  BoundStatement insert_statement;
  InsertStatement insert;
  undefined1 local_278 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  _Head_base<0UL,_duckdb::LogicalGet_*,_false> local_258;
  _Head_base<0UL,_duckdb::RegisteredStateManager_*,_false> local_250;
  vector<duckdb::LogicalType,_true> local_248;
  undefined8 local_228;
  _Head_base<0UL,_duckdb::LogicalGet_*,_false> local_220;
  _Alloc_hider local_218;
  ColumnList *local_210;
  undefined1 local_208 [16];
  pointer local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [7];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128 [24];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [160];
  
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_250._M_head_impl = (RegisteredStateManager *)__return_storage_ptr__;
  LogicalType::LogicalType((LogicalType *)local_278,BIGINT);
  __l._M_len = 1;
  __l._M_array = (iterator)local_278;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_208,__l,
             (allocator_type *)&local_248);
  local_1a8._0_8_ =
       (((vector<duckdb::LogicalType,_true> *)((long)local_250._M_head_impl + 8))->
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8._8_8_ = *(pointer *)((long)local_250._M_head_impl + 0x10);
  local_198[0]._0_8_ = *(pointer *)((long)local_250._M_head_impl + 0x18);
  (((vector<duckdb::LogicalType,_true> *)((long)local_250._M_head_impl + 8))->
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_208._0_8_;
  *(undefined8 *)((long)local_250._M_head_impl + 0x10) = local_208._8_8_;
  *(pointer *)((long)local_250._M_head_impl + 0x18) = local_1f8;
  local_208._0_8_ =
       (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)0x0;
  local_208._8_8_ = (pointer)0x0;
  local_1f8 = (pointer)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_1a8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_208);
  LogicalType::~LogicalType((LogicalType *)local_278);
  local_1a8._0_8_ = local_198;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Count","");
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_1a8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_278,__l_00,(allocator_type *)&local_248);
  local_208._0_8_ =
       ((local_250._M_head_impl)->lock).super___mutex_base._M_mutex.__data.__list.__next;
  local_208._8_8_ = ((local_250._M_head_impl)->registered_state)._M_h._M_buckets;
  local_1f8 = (pointer)((local_250._M_head_impl)->registered_state)._M_h._M_bucket_count;
  ((local_250._M_head_impl)->lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)local_278;
  ((local_250._M_head_impl)->registered_state)._M_h._M_buckets = (__buckets_ptr)_Stack_270._M_pi;
  ((local_250._M_head_impl)->registered_state)._M_h._M_bucket_count =
       local_268._M_allocated_capacity;
  local_278 = (undefined1  [8])0x0;
  _Stack_270._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_268._M_allocated_capacity = 0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_208);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_);
  }
  this_05 = &stmt->info;
  pCVar6 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     (this_05);
  if ((pCVar6->table)._M_string_length == 0) {
    this_03 = (ParserException *)__cxa_allocate_exception(0x10);
    local_1a8._0_8_ = local_198;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"COPY FROM requires a table name to be specified","");
    ParserException::ParserException(this_03,(string *)local_1a8);
    __cxa_throw(this_03,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  InsertStatement::InsertStatement((InsertStatement *)local_1a8);
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->(this_05);
  ::std::__cxx11::string::_M_assign(local_110);
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->(this_05);
  ::std::__cxx11::string::_M_assign(local_f0);
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->(this_05);
  ::std::__cxx11::string::_M_assign(local_d0);
  pCVar6 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     (this_05);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(local_128,
              &(pCVar6->select_list).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  Bind((BoundStatement *)local_208,this,(InsertStatement *)local_1a8);
  pLVar7 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)local_208);
  pLVar8 = LogicalOperator::Cast<duckdb::LogicalInsert>(pLVar7);
  this_01 = Catalog::GetSystemCatalog(this->context);
  pCVar1 = this->context;
  local_278 = (undefined1  [8])&local_268;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"main","");
  pCVar6 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     (this_05);
  local_248.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Catalog::GetEntry<duckdb::CopyFunctionCatalogEntry>
                          (this_01,pCVar1,(string *)local_278,&pCVar6->format,THROW_EXCEPTION,
                           (QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::CopyFunctionCatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::CopyFunctionCatalogEntry,_true> *)&local_248);
  local_228 = local_248.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start;
  if (local_278 != (undefined1  [8])&local_268) {
    operator_delete((void *)local_278);
  }
  if (*(copy_from_bind_t *)(local_228 + 0x1f0) != (copy_from_bind_t)0x0) {
    pCVar6 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                       (this_05);
    pCVar9 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                       (this_05);
    BindSchemaOrCatalog(this->context,&pCVar6->catalog,&pCVar9->schema);
    pCVar1 = this->context;
    pCVar6 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                       (this_05);
    pCVar9 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                       (this_05);
    pCVar10 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                        (this_05);
    local_278 = (undefined1  [8])
                Catalog::GetEntry<duckdb::TableCatalogEntry>
                          (pCVar1,&pCVar6->catalog,&pCVar9->schema,&pCVar10->table,THROW_EXCEPTION,
                           (QueryErrorContext)0xffffffffffffffff);
    optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid
              ((optional_ptr<duckdb::TableCatalogEntry,_true> *)local_278);
    this_00 = local_278;
    local_248.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_248.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_248.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __n_00 = ((long)(pLVar8->expected_types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pLVar8->expected_types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    local_218._M_p = (pointer)this;
    if ((pLVar8->column_index_map).internal_vector.
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pLVar8->column_index_map).internal_vector.
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_248,__n_00);
      pCVar11 = TableCatalogEntry::GetColumns((TableCatalogEntry *)this_00);
      CVar18 = ColumnList::Physical(pCVar11);
      pCVar11 = CVar18.list;
      if (((undefined1  [16])CVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        local_268._8_8_ =
             ((long)(pCVar11->columns).
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    .
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar11->columns).
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    .
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
      }
      else {
        local_268._8_8_ =
             (long)(pCVar11->physical_columns).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pCVar11->physical_columns).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
      }
      _Stack_270._M_pi._0_1_ = CVar18.physical;
      local_268._M_allocated_capacity = 0;
      if (((undefined1  [16])CVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (((long)(pCVar11->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pCVar11->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
      }
      else {
        p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)(pCVar11->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pCVar11->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3);
      }
      if (((undefined1  [16])CVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        lVar16 = ((long)(pCVar11->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pCVar11->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
      }
      else {
        lVar16 = (long)(pCVar11->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pCVar11->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
      }
      local_278 = (undefined1  [8])pCVar11;
      if ((p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (local_268._8_8_ != lVar16)) {
        do {
          do {
            pCVar12 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                                ((ColumnLogicalIteratorInternal *)local_278);
            __x = ColumnDefinition::Name_abi_cxx11_(pCVar12);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_248,__x);
            local_268._M_allocated_capacity = local_268._M_allocated_capacity + 1;
          } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._M_allocated_capacity
                   != p_Var17);
        } while ((local_268._8_8_ != lVar16) || (local_278 != (undefined1  [8])pCVar11));
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_248,__n_00);
      pCVar11 = TableCatalogEntry::GetColumns((TableCatalogEntry *)this_00);
      CVar18 = ColumnList::Physical(pCVar11);
      local_278 = (undefined1  [8])CVar18.list;
      if (((undefined1  [16])CVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        local_268._8_8_ =
             ((long)(((ColumnList *)local_278)->columns).
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    .
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(((ColumnList *)local_278)->columns).
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    .
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
      }
      else {
        local_268._8_8_ =
             (long)(((ColumnList *)local_278)->physical_columns).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(((ColumnList *)local_278)->physical_columns).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
      }
      _Stack_270._M_pi._0_1_ = CVar18.physical;
      local_268._M_allocated_capacity = 0;
      if (((undefined1  [16])CVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (((long)(((ColumnList *)local_278)->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(((ColumnList *)local_278)->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
      }
      else {
        p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)(((ColumnList *)local_278)->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(((ColumnList *)local_278)->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3);
      }
      if (((undefined1  [16])CVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        lVar16 = ((long)(((ColumnList *)local_278)->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(((ColumnList *)local_278)->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
      }
      else {
        lVar16 = (long)(((ColumnList *)local_278)->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(((ColumnList *)local_278)->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
      }
      local_210 = (ColumnList *)local_278;
      if ((p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (local_268._8_8_ != lVar16)) {
        do {
          pCVar12 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                              ((ColumnLogicalIteratorInternal *)local_278);
          __n = ColumnDefinition::Physical(pCVar12);
          pvVar13 = vector<unsigned_long,_true>::operator[]
                              (&(pLVar8->column_index_map).internal_vector,__n.index);
          if (*pvVar13 != 0xffffffffffffffff) {
            ColumnDefinition::Name_abi_cxx11_(pCVar12);
            pvVar13 = vector<unsigned_long,_true>::operator[]
                                (&(pLVar8->column_index_map).internal_vector,__n.index);
            pvVar14 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    *)&local_248,*pvVar13);
            ::std::__cxx11::string::_M_assign((string *)pvVar14);
          }
          local_268._M_allocated_capacity = local_268._M_allocated_capacity + 1;
        } while ((((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._M_allocated_capacity
                   != p_Var17) || (local_268._8_8_ != lVar16)) ||
                (local_278 != (undefined1  [8])local_210));
      }
    }
    p_Var2 = *(copy_from_bind_t *)(local_228 + 0x1f0);
    pCVar1 = *(ClientContext **)(local_218._M_p + 0x10);
    pCVar15 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator*
                        (this_05);
    (*p_Var2)((ClientContext *)local_278,(CopyInfo *)pCVar1,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *)pCVar15,&local_248);
    local_220._M_head_impl = (LogicalGet *)GenerateTableIndex((Binder *)local_218._M_p);
    make_uniq<duckdb::LogicalGet,unsigned_long,duckdb::TableFunction&,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<std::__cxx11::string,true>&>
              ((duckdb *)&local_258,(unsigned_long *)&local_220,(TableFunction *)(local_228 + 0x1f8)
               ,(unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *
                )local_278,&pLVar8->expected_types,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)&local_248);
    if ((pLVar8->expected_types).
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pLVar8->expected_types).
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start) {
      column_id = 0;
      do {
        this_02 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
                  operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                              *)&local_258);
        LogicalGet::AddColumnId(this_02,column_id);
        column_id = column_id + 1;
      } while (column_id <
               (ulong)(((long)(pLVar8->expected_types).
                              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              .
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pLVar8->expected_types).
                              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              .
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
              );
    }
    pLVar7 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)local_208);
    local_220._M_head_impl = local_258._M_head_impl;
    local_258._M_head_impl = (LogicalGet *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
              ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                *)&pLVar7->children,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_220);
    if (local_220._M_head_impl != (LogicalGet *)0x0) {
      (*((local_220._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
    }
    uVar5 = local_208._0_8_;
    local_208._0_8_ =
         (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)0x0;
    tVar3.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )((local_250._M_head_impl)->lock).super___mutex_base._M_mutex.__align;
    ((local_250._M_head_impl)->lock).super___mutex_base._M_mutex.__align = uVar5;
    if (tVar3.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
        (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
      (**(code **)(*(long *)tVar3.
                            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl +
                  8))();
    }
    if (local_258._M_head_impl != (LogicalGet *)0x0) {
      (*((local_258._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
    }
    if (local_278 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_278 + 8))();
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_248);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_1e8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(local_208 + 8))
    ;
    if ((LogicalOperator *)local_208._0_8_ != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_208._0_8_ + 8))();
    }
    InsertStatement::~InsertStatement((InsertStatement *)local_1a8);
    return (BoundStatement *)
           (tuple<duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
            )local_250._M_head_impl;
  }
  this_04 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_278 = (undefined1  [8])&local_268;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_278,"COPY FROM is not supported for FORMAT \"%s\"","");
  pCVar6 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     (this_05);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  pcVar4 = (pCVar6->format)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar4,pcVar4 + (pCVar6->format)._M_string_length);
  NotImplementedException::NotImplementedException<std::__cxx11::string>
            (this_04,(string *)local_278,&local_1c8);
  __cxa_throw(this_04,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BoundStatement Binder::BindCopyFrom(CopyStatement &stmt) {
	BoundStatement result;
	result.types = {LogicalType::BIGINT};
	result.names = {"Count"};

	if (stmt.info->table.empty()) {
		throw ParserException("COPY FROM requires a table name to be specified");
	}
	// COPY FROM a file
	// generate an insert statement for the to-be-inserted table
	InsertStatement insert;
	insert.table = stmt.info->table;
	insert.schema = stmt.info->schema;
	insert.catalog = stmt.info->catalog;
	insert.columns = stmt.info->select_list;

	// bind the insert statement to the base table
	auto insert_statement = Bind(insert);
	D_ASSERT(insert_statement.plan->type == LogicalOperatorType::LOGICAL_INSERT);

	auto &bound_insert = insert_statement.plan->Cast<LogicalInsert>();

	// lookup the format in the catalog
	auto &catalog = Catalog::GetSystemCatalog(context);
	auto &copy_function = catalog.GetEntry<CopyFunctionCatalogEntry>(context, DEFAULT_SCHEMA, stmt.info->format);
	if (!copy_function.function.copy_from_bind) {
		throw NotImplementedException("COPY FROM is not supported for FORMAT \"%s\"", stmt.info->format);
	}
	// lookup the table to copy into
	BindSchemaOrCatalog(stmt.info->catalog, stmt.info->schema);
	auto &table =
	    Catalog::GetEntry<TableCatalogEntry>(context, stmt.info->catalog, stmt.info->schema, stmt.info->table);
	vector<string> expected_names;
	if (!bound_insert.column_index_map.empty()) {
		expected_names.resize(bound_insert.expected_types.size());
		for (auto &col : table.GetColumns().Physical()) {
			auto i = col.Physical();
			if (bound_insert.column_index_map[i] != DConstants::INVALID_INDEX) {
				expected_names[bound_insert.column_index_map[i]] = col.Name();
			}
		}
	} else {
		expected_names.reserve(bound_insert.expected_types.size());
		for (auto &col : table.GetColumns().Physical()) {
			expected_names.push_back(col.Name());
		}
	}

	auto function_data =
	    copy_function.function.copy_from_bind(context, *stmt.info, expected_names, bound_insert.expected_types);
	auto get = make_uniq<LogicalGet>(GenerateTableIndex(), copy_function.function.copy_from_function,
	                                 std::move(function_data), bound_insert.expected_types, expected_names);
	for (idx_t i = 0; i < bound_insert.expected_types.size(); i++) {
		get->AddColumnId(i);
	}
	insert_statement.plan->children.push_back(std::move(get));
	result.plan = std::move(insert_statement.plan);
	return result;
}